

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

string * __thiscall
Catch::TextFlow::Column::const_iterator::addIndentAndSuffix_abi_cxx11_
          (string *__return_storage_ptr__,const_iterator *this,size_t position,size_t length)

{
  size_t sVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = 0xffffffffffffffff;
  if (this->m_lineStart == 0) {
    sVar1 = this->m_column->m_initialIndent;
  }
  if (sVar1 == 0xffffffffffffffff) {
    sVar1 = this->m_column->m_indent;
  }
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::_M_replace_aux
            ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,(char)sVar1);
  std::__cxx11::string::append((string *)__return_storage_ptr__,(ulong)this->m_column,position);
  if (this->m_addHyphen == true) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
        Column::const_iterator::addIndentAndSuffix( size_t position,
                                              size_t length ) const {
            std::string ret;
            const auto desired_indent = indentSize();
            ret.reserve( desired_indent + length + m_addHyphen );
            ret.append( desired_indent, ' ' );
            ret.append( m_column.m_string, position, length );
            if ( m_addHyphen ) {
                ret.push_back( '-' );
            }

            return ret;
        }